

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestResults.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_3dd33::TestNotifiesReporterOfTestStartWithCorrectInfo::RunImpl
          (TestNotifiesReporterOfTestStartWithCorrectInfo *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestResults results;
  RecordingReporter reporter;
  int local_874;
  TestDetails local_870;
  TestResults local_850;
  TestReporter local_838;
  int local_830;
  char local_82c [256];
  char local_72c [256];
  undefined4 local_62c;
  undefined1 local_628;
  undefined4 local_528;
  undefined1 local_524;
  undefined1 local_424;
  undefined1 local_324;
  undefined4 local_224;
  undefined1 local_220;
  undefined1 local_120;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  
  local_838._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150810;
  local_830 = 0;
  local_62c = 0;
  local_528 = 0;
  local_224 = 0;
  local_82c[0] = '\0';
  local_72c[0] = '\0';
  local_628 = 0;
  local_524 = 0;
  local_424 = 0;
  local_324 = 0;
  local_220 = 0;
  local_120 = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  UnitTest::TestResults::TestResults(&local_850,&local_838);
  UnitTest::TestResults::OnTestStart(&local_850,(TestDetails *)(anonymous_namespace)::details);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_874 = 1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,0x40);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_874,&local_830,&local_870);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,0x41);
  UnitTest::CheckEqual(pTVar1,"suitename",local_82c,&local_870);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,0x42);
  UnitTest::CheckEqual(pTVar1,"testname",local_72c,&local_870);
  UnitTest::TestReporter::~TestReporter(&local_838);
  return;
}

Assistant:

TEST(RecordsNumbersOfTests)
{
    TestResults results;
    results.OnTestStart(details);
    results.OnTestStart(details);
    results.OnTestStart(details);
    CHECK_EQUAL(3, results.GetTotalTestCount());
}